

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_cl_parser.cxx
# Opt level: O0

bool __thiscall cl_parser::parse(cl_parser *this,int argc,char **argv,int optc,option_desc *optv)

{
  option_type oVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  ulong uVar5;
  option *poVar6;
  size_t sVar7;
  double dVar8;
  option *opt;
  option_desc *poStack_58;
  int j;
  option_desc *desc;
  long lStack_48;
  bool valid;
  size_t param_idx;
  size_t opt_idx;
  option_desc *optv_local;
  char **ppcStack_28;
  int optc_local;
  char **argv_local;
  int argc_local;
  cl_parser *this_local;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)argc;
  uVar5 = SUB168(auVar2 * ZEXT816(0x18),0);
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  poVar6 = (option *)operator_new__(uVar5);
  this->m_options = poVar6;
  this->m_argc = (long)(int)(argc & 0x7fffffff);
  param_idx = 0;
  lStack_48 = (long)(int)(argc & 0x7fffffff) + -1;
  ppcStack_28 = argv + 1;
  argv_local._4_4_ = argc;
  do {
    if (argv_local._4_4_ < 2) {
      this->m_num_options = param_idx;
      return true;
    }
    if (**ppcStack_28 == '-') {
      bVar3 = false;
      poStack_58 = optv;
      for (opt._4_4_ = optc; 0 < opt._4_4_; opt._4_4_ = opt._4_4_ + -1) {
        iVar4 = strcmp(*ppcStack_28,poStack_58->name);
        if (iVar4 == 0) {
          bVar3 = true;
          sVar7 = param_idx + 1;
          poVar6 = this->m_options + param_idx;
          poVar6->name = poStack_58->name;
          poVar6->type = poStack_58->type;
          param_idx = sVar7;
          if (poVar6->type == OT_BOOL) {
            (poVar6->field_2).v_bool = true;
          }
          else {
            argv_local._4_4_ = argv_local._4_4_ + -1;
            if (argv_local._4_4_ < 2) {
              return false;
            }
            ppcStack_28 = ppcStack_28 + 1;
            oVar1 = poVar6->type;
            if (oVar1 == OT_STRING) {
              (poVar6->field_2).v_string = *ppcStack_28;
            }
            else if (oVar1 == OT_FLOAT) {
              dVar8 = atof(*ppcStack_28);
              (poVar6->field_2).v_float = (float)dVar8;
            }
            else {
              if (oVar1 != OT_INTEGER) {
                return false;
              }
              iVar4 = atoi(*ppcStack_28);
              (poVar6->field_2).v_integer = iVar4;
            }
          }
          break;
        }
        poStack_58 = poStack_58 + 1;
      }
      if (!bVar3) {
        return false;
      }
    }
    else {
      this->m_options[lStack_48].name = *ppcStack_28;
      lStack_48 = lStack_48 + -1;
      this->m_num_params = this->m_num_params + 1;
    }
    ppcStack_28 = ppcStack_28 + 1;
    argv_local._4_4_ = argv_local._4_4_ + -1;
  } while( true );
}

Assistant:

bool cl_parser::parse(int argc, const char* const argv[],
		int optc, const option_desc* optv)
{
	m_options = new option[argc];
	m_argc = size_t(argc & INT_MAX);

	size_t opt_idx = 0, param_idx = size_t(argc & INT_MAX) - 1;
	for (++argv; argc > 1; ++argv, --argc) {
		if ((*argv)[0] != '-') {
			m_options[param_idx].name = *argv;
			--param_idx;
			++m_num_params;
			continue;
		}
		bool valid = false;
		const option_desc* desc = optv;
		for (int j = optc; j > 0; --j, ++desc) {
			if (std::strcmp(*argv, desc->name) != 0)
				continue;
			valid = true;
			option& opt = m_options[opt_idx++];
			opt.name = desc->name;
			opt.type = desc->type;
			if (opt.type == OT_BOOL) {
				opt.v_bool = true;
			} else if (--argc <= 1) {
				return false;
			} else {
				++argv;
				switch (opt.type) {
				case OT_STRING:
					opt.v_string = *argv;
					break;
				case OT_INTEGER:
					opt.v_integer = std::atoi(*argv);
					break;
				case OT_FLOAT:
					opt.v_float = float(std::atof(*argv));
					break;
				default:
					return false;
				}
			}
			break;
		}
		if (!valid)
			return false;
	}
	m_num_options = opt_idx;
	return true;
}